

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

bool __thiscall presolve::HPresolve::isImpliedEquationAtUpper(HPresolve *this,HighsInt row)

{
  double *pdVar1;
  double dVar2;
  
  dVar2 = -(this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  pdVar1 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + row;
  return *pdVar1 <= dVar2 && dVar2 != *pdVar1;
}

Assistant:

bool HPresolve::isImpliedEquationAtUpper(HighsInt row) const {
  // if the implied upper bound on a row dual is strictly negative then the row
  // is an implied equation (using its upper bound) due to complementary
  // slackness
  bool isUbndNegative =
      implRowDualUpper[row] < -options->dual_feasibility_tolerance;
  assert(!isUbndNegative || model->row_upper_[row] != kHighsInf);
  return isUbndNegative;
}